

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O1

FName __thiscall FSkillInfo::GetReplacement(FSkillInfo *this,FName *a)

{
  uint *puVar1;
  Node *pNVar2;
  long *plVar3;
  int iVar4;
  uint *in_RDX;
  FName local_c;
  
  local_c.Index = *in_RDX;
  plVar3 = (long *)((ulong)(a[0x2c].Index - 1U & local_c.Index) * 0x10 + *(long *)(a + 0x28));
  do {
    iVar4 = 0;
    if ((plVar3 == (long *)0x0) || (iVar4 = 0, (long *)*plVar3 == (long *)0x1)) goto LAB_00394bf3;
    puVar1 = (uint *)(plVar3 + 1);
    plVar3 = (long *)*plVar3;
  } while (*puVar1 != local_c.Index);
  pNVar2 = TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::GetNode
                     ((TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_> *)(a + 0x28),
                      &local_c);
  iVar4 = (pNVar2->Pair).Value.Index;
LAB_00394bf3:
  (this->Name).Index = iVar4;
  return (FName)(int)this;
}

Assistant:

FName FSkillInfo::GetReplacement(FName a)
{
	if (Replace.CheckKey(a)) return Replace[a];
	else return NAME_None;
}